

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IGXMLScanner.cpp
# Opt level: O3

bool __thiscall xercesc_4_0::IGXMLScanner::scanStartTag(IGXMLScanner *this,bool *gotData)

{
  ReaderMgr *this_00;
  XMLBuffer *toFill;
  short *psVar1;
  short *psVar2;
  uint uVar3;
  Grammar *pGVar4;
  NameIdPool<xercesc_4_0::DTDElementDecl> *pNVar5;
  XMLValidator *pXVar6;
  XMLReader *this_01;
  BaseRefVectorOf<xercesc_4_0::XMLAttr> *pBVar7;
  XMLDocumentHandler *pXVar8;
  bool *pbVar9;
  bool bVar10;
  byte bVar11;
  XMLCh XVar12;
  int iVar13;
  undefined4 extraout_var;
  DTDElementDecl *this_02;
  XMLSize_t XVar14;
  DTDAttDef *pDVar15;
  XMLAttr *pXVar16;
  XMLCh *pXVar17;
  uint *puVar18;
  undefined4 extraout_var_00;
  long *plVar19;
  long lVar20;
  long *plVar21;
  RefHashTableBucketElem<unsigned_int> *pRVar22;
  XMLCh *text2;
  ulong uVar23;
  undefined4 extraout_var_02;
  UnexpectedEOFException *this_03;
  XMLByte *pXVar24;
  AttTypes AVar25;
  RefHashTableBucketElem<xercesc_4_0::DTDElementDecl> *pRVar26;
  ulong uVar27;
  XMLCh *pXVar28;
  bool bFoundSpace;
  undefined8 local_80;
  XMLCh *local_78;
  DTDAttDef *local_70;
  XMLSize_t local_68;
  XMLCh *local_60;
  ElemStack *local_58;
  bool *local_50;
  XMLBuffer *local_48;
  XMLAttr *local_40;
  XMLSize_t failure;
  undefined4 extraout_var_01;
  
  *gotData = true;
  this_00 = &(this->super_XMLScanner).fReaderMgr;
  (this->super_XMLScanner).fQNameBuf.fIndex = 0;
  bVar10 = XMLReader::getName((this->super_XMLScanner).fReaderMgr.fCurReader,
                              &(this->super_XMLScanner).fQNameBuf,false);
  if (!bVar10) {
    XMLScanner::emitError(&this->super_XMLScanner,ExpectedElementName);
    do {
      XVar12 = ReaderMgr::getNextChar(this_00);
      if (XVar12 == L'\0') {
        return false;
      }
    } while (XVar12 != L'<');
    return false;
  }
  pXVar28 = (this->super_XMLScanner).fQNameBuf.fBuffer;
  pXVar28[(this->super_XMLScanner).fQNameBuf.fIndex] = L'\0';
  pGVar4 = (this->super_XMLScanner).fGrammar;
  local_50 = gotData;
  iVar13 = (*(pGVar4->super_XSerializable)._vptr_XSerializable[0xb])
                     (pGVar4,(ulong)(this->super_XMLScanner).fEmptyNamespaceId,0);
  this_02 = (DTDElementDecl *)CONCAT44(extraout_var,iVar13);
  if (this_02 == (DTDElementDecl *)0x0) {
    pNVar5 = this->fDTDElemNonDeclPool;
    if (pNVar5->fIdCounter != 0) {
      uVar27 = (ulong)(ushort)*pXVar28;
      if (uVar27 == 0) {
        uVar27 = 0;
      }
      else {
        XVar12 = pXVar28[1];
        if (XVar12 != L'\0') {
          pXVar17 = pXVar28 + 2;
          do {
            uVar27 = (ulong)(ushort)XVar12 + (uVar27 >> 0x18) + uVar27 * 0x26;
            XVar12 = *pXVar17;
            pXVar17 = pXVar17 + 1;
          } while (XVar12 != L'\0');
        }
        uVar27 = uVar27 % (pNVar5->fBucketList).fHashModulus;
      }
      pRVar26 = (pNVar5->fBucketList).fBucketList[uVar27];
      if (pRVar26 != (RefHashTableBucketElem<xercesc_4_0::DTDElementDecl> *)0x0) {
        do {
          bVar10 = StringHasher::equals
                             ((StringHasher *)&(pNVar5->fBucketList).field_0x30,pXVar28,
                              pRVar26->fKey);
          if (bVar10) {
            this_02 = pRVar26->fData;
            if (this_02 != (DTDElementDecl *)0x0) goto LAB_0029ff1f;
            break;
          }
          pRVar26 = pRVar26->fNext;
        } while (pRVar26 != (RefHashTableBucketElem<xercesc_4_0::DTDElementDecl> *)0x0);
      }
    }
    this_02 = (DTDElementDecl *)XMemory::operator_new(0x58,(this->super_XMLScanner).fMemoryManager);
    DTDElementDecl::DTDElementDecl
              (this_02,pXVar28,(this->super_XMLScanner).fEmptyNamespaceId,Any,
               (this->super_XMLScanner).fMemoryManager);
    XVar14 = NameIdPool<xercesc_4_0::DTDElementDecl>::put(this->fDTDElemNonDeclPool,this_02);
    (this_02->super_XMLElementDecl).fId = XVar14;
    if ((this->super_XMLScanner).fValidate != true) goto LAB_002a007b;
    (this_02->super_XMLElementDecl).fCreateReason = JustFaultIn;
  }
  else {
LAB_0029ff1f:
    if (((this->super_XMLScanner).fValidate != true) ||
       ((this_02->super_XMLElementDecl).fCreateReason == Declared)) goto LAB_002a007b;
  }
  pXVar6 = (this->super_XMLScanner).fValidator;
  pXVar28 = QName::getRawName((this_02->super_XMLElementDecl).fElementName);
  XMLValidator::emitError(pXVar6,ElementNotDefined,pXVar28,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
LAB_002a007b:
  local_58 = &(this->super_XMLScanner).fElemStack;
  XVar14 = (this->super_XMLScanner).fElemStack.fStackTop;
  ElemStack::addLevel(local_58,&this_02->super_XMLElementDecl,
                      ((this->super_XMLScanner).fReaderMgr.fCurReader)->fReaderNum);
  bVar10 = (this->super_XMLScanner).fValidate;
  (this->super_XMLScanner).fElemStack.fStack[(this->super_XMLScanner).fElemStack.fStackTop - 1]->
  fValidationFlag = bVar10;
  if (bVar10 == true) {
    pXVar6 = (this->super_XMLScanner).fValidator;
    (*pXVar6->_vptr_XMLValidator[9])(pXVar6,this_02);
  }
  if (XVar14 == 0) {
    (this->super_XMLScanner).fRootGrammar = (this->super_XMLScanner).fGrammar;
    if (((this->super_XMLScanner).fValidate == true) &&
       (pXVar28 = (this->super_XMLScanner).fRootElemName, pXVar28 != (XMLCh *)0x0)) {
      pXVar17 = (this->super_XMLScanner).fQNameBuf.fBuffer;
      pXVar17[(this->super_XMLScanner).fQNameBuf.fIndex] = L'\0';
      if (pXVar17 != pXVar28) {
        lVar20 = 0;
        do {
          psVar1 = (short *)((long)pXVar17 + lVar20);
          if (*psVar1 == 0) {
            if (*(short *)((long)pXVar28 + lVar20) == 0) goto LAB_002a0157;
            break;
          }
          psVar2 = (short *)((long)pXVar28 + lVar20);
          lVar20 = lVar20 + 2;
        } while (*psVar1 == *psVar2);
        XMLValidator::emitError((this->super_XMLScanner).fValidator,RootElemNotLikeDocType);
      }
    }
  }
  else {
    ElemStack::addChild(local_58,(this_02->super_XMLElementDecl).fElementName,true);
  }
LAB_002a0157:
  local_68 = XVar14;
  ReaderMgr::skipPastSpaces(this_00);
  local_60 = (XMLCh *)(((this->super_XMLScanner).fAttrList)->
                      super_BaseRefVectorOf<xercesc_4_0::XMLAttr>).fCurCount;
  this->fElemCount = this->fElemCount + 1;
  toFill = &(this->super_XMLScanner).fAttNameBuf;
  local_48 = &(this->super_XMLScanner).fAttValueBuf;
  pXVar28 = (XMLCh *)0x0;
LAB_002a019c:
  while( true ) {
    XVar12 = ReaderMgr::peekNextChar(this_00);
    if (((pXVar28 != (XMLCh *)0x0) && (XVar12 != L'/')) && (XVar12 != L'>')) {
      ReaderMgr::skipPastSpaces(this_00,&bFoundSpace,false);
      if (bFoundSpace == false) {
        XMLScanner::emitError(&this->super_XMLScanner,ExpectedWhitespace);
      }
      XVar12 = ReaderMgr::peekNextChar(this_00);
    }
    this_01 = (this->super_XMLScanner).fReaderMgr.fCurReader;
    pXVar24 = this_01->fgCharCharsTable;
    if ((pXVar24[(ushort)XVar12] & 0x10) == 0) break;
    if ((ushort)XVar12 < 0x27) {
      if (XVar12 == L'\"') {
LAB_002a0281:
        XMLScanner::emitError(&this->super_XMLScanner,ExpectedAttrName);
        ReaderMgr::getNextChar(this_00);
        ReaderMgr::skipQuotedString(this_00,XVar12);
        ReaderMgr::skipPastSpaces(this_00);
      }
      else if (XVar12 == L'\0') {
        this_03 = (UnexpectedEOFException *)__cxa_allocate_exception(0x30);
        UnexpectedEOFException::UnexpectedEOFException
                  (this_03,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/IGXMLScanner.cpp"
                   ,0x77c,Gen_UnexpectedEOF,(this->super_XMLScanner).fMemoryManager);
        __cxa_throw(this_03,&UnexpectedEOFException::typeinfo,XMLException::~XMLException);
      }
    }
    else if ((ushort)XVar12 < 0x2f) {
      if (XVar12 == L'\'') goto LAB_002a0281;
    }
    else {
      if (XVar12 == L'/') {
        ReaderMgr::getNextChar(this_00);
        bVar10 = ReaderMgr::skippedChar(this_00,L'>');
        local_70 = (DTDAttDef *)CONCAT71((int7)((ulong)pXVar24 >> 8),1);
        if (!bVar10) {
          pXVar17 = QName::getRawName((this_02->super_XMLElementDecl).fElementName);
LAB_002a06bc:
          XMLScanner::emitError
                    (&this->super_XMLScanner,UnterminatedStartTag,pXVar17,(XMLCh *)0x0,(XMLCh *)0x0,
                     (XMLCh *)0x0);
        }
        goto LAB_002a06ec;
      }
      if (XVar12 == L'<') {
        pXVar17 = QName::getRawName((this_02->super_XMLElementDecl).fElementName);
        local_70 = (DTDAttDef *)0x0;
        goto LAB_002a06bc;
      }
      if (XVar12 == L'>') goto LAB_002a06d6;
    }
  }
  toFill->fIndex = 0;
  bVar10 = XMLReader::getName(this_01,toFill,false);
  if (!bVar10) {
    XMLScanner::emitError(&this->super_XMLScanner,ExpectedAttrName);
    do {
      XVar12 = ReaderMgr::getNextChar(this_00);
      if (XVar12 == L'\0') {
        return false;
      }
    } while (XVar12 != L'>');
    return false;
  }
  bVar10 = XMLScanner::scanEq(&this->super_XMLScanner,false);
  if (!bVar10) {
    XMLScanner::emitError(&this->super_XMLScanner,ExpectedEqSign);
    XVar12 = ReaderMgr::skipUntilInOrWS(this_00,L"\'\"></");
    if ((ushort)XVar12 < 0x3e) {
      if (XVar12 == L'/') goto LAB_002a019c;
      if ((XVar12 == L'\"') || (XVar12 == L'\'')) goto LAB_002a02cf;
    }
    else if (XVar12 == L'>') goto LAB_002a019c;
    if (-1 < (char)((this->super_XMLScanner).fReaderMgr.fCurReader)->fgCharCharsTable
                   [(ushort)XVar12]) goto LAB_002a0a48;
  }
LAB_002a02cf:
  pXVar17 = (this->super_XMLScanner).fAttNameBuf.fBuffer;
  pXVar17[(this->super_XMLScanner).fAttNameBuf.fIndex] = L'\0';
  pDVar15 = DTDElementDecl::getAttDef(this_02,pXVar17);
  local_78 = pXVar28;
  local_70 = pDVar15;
  if (pXVar28 < local_60) {
    pXVar16 = BaseRefVectorOf<xercesc_4_0::XMLAttr>::elementAt
                        (&((this->super_XMLScanner).fAttrList)->
                          super_BaseRefVectorOf<xercesc_4_0::XMLAttr>,(XMLSize_t)pXVar28);
    if (pDVar15 == (DTDAttDef *)0x0) {
      local_80 = (MemoryManager *)((ulong)local_80._4_4_ << 0x20);
    }
    else {
      local_80 = (MemoryManager *)CONCAT44(local_80._4_4_,(pDVar15->super_XMLAttDef).fType);
    }
    QName::setName(pXVar16->fAttName,L"",pXVar17,0);
    XMLAttr::setValue(pXVar16,L"");
    pXVar16->fType = (AttTypes)local_80;
    pXVar16->fSpecified = true;
  }
  else {
    local_80 = (this->super_XMLScanner).fMemoryManager;
    pXVar16 = (XMLAttr *)XMemory::operator_new(0x28,local_80);
    if (pDVar15 == (DTDAttDef *)0x0) {
      AVar25 = AttTypes_Min;
    }
    else {
      AVar25 = (pDVar15->super_XMLAttDef).fType;
    }
    XMLAttr::XMLAttr(pXVar16,0,pXVar17,L"",L"",AVar25,true,(this->super_XMLScanner).fMemoryManager,
                     (DatatypeValidator *)0x0,false);
    pBVar7 = &((this->super_XMLScanner).fAttrList)->super_BaseRefVectorOf<xercesc_4_0::XMLAttr>;
    BaseRefVectorOf<xercesc_4_0::XMLAttr>::ensureExtraCapacity(pBVar7,1);
    XVar14 = pBVar7->fCurCount;
    pBVar7->fElemList[XVar14] = pXVar16;
    pBVar7->fCurCount = XVar14 + 1;
  }
  pDVar15 = local_70;
  local_80 = (MemoryManager *)pXVar16->fAttName->fLocalPart;
  local_40 = pXVar16;
  if (local_70 == (DTDAttDef *)0x0) {
    if ((this->super_XMLScanner).fValidate == true) {
      pXVar28 = (this->super_XMLScanner).fAttNameBuf.fBuffer;
      pXVar6 = (this->super_XMLScanner).fValidator;
      pXVar28[(this->super_XMLScanner).fAttNameBuf.fIndex] = L'\0';
      pXVar17 = QName::getRawName((this_02->super_XMLElementDecl).fElementName);
      XMLValidator::emitError
                (pXVar6,AttNotDefinedForElement,pXVar28,pXVar17,(XMLCh *)0x0,(XMLCh *)0x0);
    }
    pXVar28 = (XMLCh *)local_80;
    bVar10 = Hash2KeysSetOf<xercesc_4_0::StringHasher>::putIfNotPresent
                       (this->fUndeclaredAttrRegistry,local_80,0);
    if (!bVar10) {
      pXVar17 = QName::getRawName((this_02->super_XMLElementDecl).fElementName);
      XMLScanner::emitError
                (&this->super_XMLScanner,AttrAlreadyUsedInSTag,pXVar28,pXVar17,(XMLCh *)0x0,
                 (XMLCh *)0x0);
    }
  }
  else {
    for (pRVar22 = this->fAttDefRegistry->fBucketList
                   [(ulong)local_70 % this->fAttDefRegistry->fHashModulus];
        pRVar22 != (RefHashTableBucketElem<unsigned_int> *)0x0; pRVar22 = pRVar22->fNext) {
      if ((DTDAttDef *)pRVar22->fKey == local_70) {
        puVar18 = pRVar22->fData;
        if (puVar18 != (uint *)0x0) {
          if (*puVar18 < this->fElemCount) {
            *puVar18 = this->fElemCount;
            pXVar28 = (XMLCh *)local_80;
          }
          else {
            iVar13 = (*(local_70->super_XMLAttDef).super_XSerializable._vptr_XSerializable[5])
                               (local_70);
            pXVar28 = QName::getRawName((this_02->super_XMLElementDecl).fElementName);
            XMLScanner::emitError
                      (&this->super_XMLScanner,AttrAlreadyUsedInSTag,
                       (XMLCh *)CONCAT44(extraout_var_00,iVar13),pXVar28,(XMLCh *)0x0,(XMLCh *)0x0);
            pXVar28 = (XMLCh *)local_80;
          }
          goto LAB_002a053e;
        }
        break;
      }
    }
    puVar18 = XMLScanner::getNewUIntPtr(&this->super_XMLScanner);
    *puVar18 = this->fElemCount;
    RefHashTableOf<unsigned_int,_xercesc_4_0::PtrHasher>::put(this->fAttDefRegistry,pDVar15,puVar18)
    ;
    pXVar28 = (XMLCh *)local_80;
  }
LAB_002a053e:
  ReaderMgr::skipPastSpaces(this_00);
  bVar10 = scanAttValue(this,&pDVar15->super_XMLAttDef,pXVar28,local_48);
  if (!bVar10) {
    XMLScanner::emitError(&this->super_XMLScanner,ExpectedAttrValue);
    XVar12 = ReaderMgr::skipUntilInOrWS(this_00,L"></");
    if (((XVar12 != L'/') && (XVar12 != L'>')) &&
       (-1 < (char)((this->super_XMLScanner).fReaderMgr.fCurReader)->fgCharCharsTable
                   [(ushort)XVar12])) {
LAB_002a0a48:
      if (XVar12 != L'<') {
        return false;
      }
      pXVar28 = QName::getRawName((this_02->super_XMLElementDecl).fElementName);
      XMLScanner::emitError
                (&this->super_XMLScanner,UnterminatedStartTag,pXVar28,(XMLCh *)0x0,(XMLCh *)0x0,
                 (XMLCh *)0x0);
      return false;
    }
  }
  pXVar28 = (this->super_XMLScanner).fAttValueBuf.fBuffer;
  pXVar28[(this->super_XMLScanner).fAttValueBuf.fIndex] = L'\0';
  XMLAttr::setValue(local_40,pXVar28);
  if ((pDVar15 != (DTDAttDef *)0x0) && ((this->super_XMLScanner).fValidate == true)) {
    pXVar28 = (this->super_XMLScanner).fAttValueBuf.fBuffer;
    pXVar6 = (this->super_XMLScanner).fValidator;
    pXVar28[(this->super_XMLScanner).fAttValueBuf.fIndex] = L'\0';
    (*pXVar6->_vptr_XMLValidator[8])(pXVar6,pDVar15,pXVar28,0);
  }
  pXVar28 = (XMLCh *)((long)local_78 + 1);
  goto LAB_002a019c;
LAB_002a06d6:
  ReaderMgr::getNextChar(this_00);
  local_70 = (DTDAttDef *)0x0;
LAB_002a06ec:
  if (pXVar28 != (XMLCh *)0x0) {
    Hash2KeysSetOf<xercesc_4_0::StringHasher>::removeAll(this->fUndeclaredAttrRegistry);
  }
  iVar13 = (*(this_02->super_XMLElementDecl).super_XSerializable._vptr_XSerializable[7])(this_02);
  if ((char)iVar13 != '\0') {
    iVar13 = (*(this_02->super_XMLElementDecl).super_XSerializable._vptr_XSerializable[5])(this_02);
    plVar19 = (long *)CONCAT44(extraout_var_01,iVar13);
    lVar20 = (**(code **)(*plVar19 + 0x50))(plVar19);
    if (lVar20 != 0) {
      uVar27 = 0;
      do {
        plVar21 = (long *)(**(code **)(*plVar19 + 0x58))(plVar19,uVar27);
        uVar3 = *(uint *)(plVar21 + 1);
        for (pRVar22 = this->fAttDefRegistry->fBucketList
                       [(ulong)plVar21 % this->fAttDefRegistry->fHashModulus];
            pRVar22 != (RefHashTableBucketElem<unsigned_int> *)0x0; pRVar22 = pRVar22->fNext) {
          if ((long *)pRVar22->fKey == plVar21) {
            if ((pRVar22->fData != (uint *)0x0) && (this->fElemCount <= *pRVar22->fData))
            goto LAB_002a0939;
            break;
          }
        }
        bVar11 = (this->super_XMLScanner).fValidate;
        if ((bool)bVar11 == true) {
          if (uVar3 == 2) {
            pXVar6 = (this->super_XMLScanner).fValidator;
            pXVar17 = (XMLCh *)(**(code **)(*plVar21 + 0x28))(plVar21);
            XMLValidator::emitError
                      (pXVar6,RequiredAttrNotProvided,pXVar17,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0
                      );
          }
          else if (uVar3 < 2) {
            if (((this->super_XMLScanner).fStandalone == true) &&
               (*(char *)((long)plVar21 + 0x14) == '\x01')) {
              pXVar6 = (this->super_XMLScanner).fValidator;
              local_78 = pXVar28;
              pXVar17 = (XMLCh *)(**(code **)(*plVar21 + 0x28))(plVar21);
              text2 = QName::getRawName((this_02->super_XMLElementDecl).fElementName);
              pXVar28 = local_78;
              XMLValidator::emitError
                        (pXVar6,NoDefAttForStandalone,pXVar17,text2,(XMLCh *)0x0,(XMLCh *)0x0);
              bVar11 = (this->super_XMLScanner).fValidate;
            }
            goto LAB_002a07ca;
          }
        }
        else if (uVar3 < 2) {
LAB_002a07ca:
          if ((bVar11 & 1) != 0) {
            pXVar6 = (this->super_XMLScanner).fValidator;
            (*pXVar6->_vptr_XMLValidator[8])(pXVar6,plVar21,plVar21[4],0);
          }
          if (pXVar28 < local_60) {
            pXVar16 = BaseRefVectorOf<xercesc_4_0::XMLAttr>::elementAt
                                (&((this->super_XMLScanner).fAttrList)->
                                  super_BaseRefVectorOf<xercesc_4_0::XMLAttr>,(XMLSize_t)pXVar28);
            pXVar17 = (XMLCh *)(**(code **)(*plVar21 + 0x28))(plVar21);
            local_78 = (XMLCh *)plVar21[4];
            AVar25 = *(AttTypes *)((long)plVar21 + 0xc);
            QName::setName(pXVar16->fAttName,L"",pXVar17,0);
            XMLAttr::setValue(pXVar16,local_78);
            pXVar16->fType = AVar25;
            pXVar16->fSpecified = false;
          }
          else {
            local_78 = pXVar28;
            pXVar16 = (XMLAttr *)XMemory::operator_new(0x28,(this->super_XMLScanner).fMemoryManager)
            ;
            pXVar28 = (XMLCh *)(**(code **)(*plVar21 + 0x28))(plVar21);
            XMLAttr::XMLAttr(pXVar16,0,pXVar28,L"",(XMLCh *)plVar21[4],
                             *(AttTypes *)((long)plVar21 + 0xc),false,
                             (this->super_XMLScanner).fMemoryManager,(DatatypeValidator *)0x0,false)
            ;
            pBVar7 = &((this->super_XMLScanner).fAttrList)->
                      super_BaseRefVectorOf<xercesc_4_0::XMLAttr>;
            BaseRefVectorOf<xercesc_4_0::XMLAttr>::ensureExtraCapacity(pBVar7,1);
            XVar14 = pBVar7->fCurCount;
            pBVar7->fElemList[XVar14] = pXVar16;
            pBVar7->fCurCount = XVar14 + 1;
            local_60 = (XMLCh *)((long)local_60 + 1);
            pXVar28 = local_78;
          }
          pXVar28 = (XMLCh *)((long)pXVar28 + 1);
        }
LAB_002a0939:
        uVar27 = uVar27 + 1;
        uVar23 = (**(code **)(*plVar19 + 0x50))(plVar19);
      } while (uVar27 < uVar23);
    }
  }
  pbVar9 = local_50;
  XVar14 = local_68;
  if ((char)local_70 != '\0') {
    if (((this->super_XMLScanner).fValidate == true) &&
       (pXVar6 = (this->super_XMLScanner).fValidator,
       iVar13 = (*pXVar6->_vptr_XMLValidator[2])(pXVar6,this_02,0,0), (char)iVar13 == '\0')) {
      pXVar6 = (this->super_XMLScanner).fValidator;
      pXVar17 = QName::getRawName((this_02->super_XMLElementDecl).fElementName);
      iVar13 = (*(this_02->super_XMLElementDecl).super_XSerializable._vptr_XSerializable[0xd])
                         (this_02);
      XVar14 = local_68;
      XMLValidator::emitError
                (pXVar6,ElementNotValidForContent,pXVar17,(XMLCh *)CONCAT44(extraout_var_02,iVar13),
                 (XMLCh *)0x0,(XMLCh *)0x0);
    }
    ElemStack::popTop(local_58);
    if (XVar14 == 0) {
      *pbVar9 = false;
    }
    else {
      (this->super_XMLScanner).fValidate =
           (this->super_XMLScanner).fElemStack.fStack
           [(this->super_XMLScanner).fElemStack.fStackTop - 1]->fValidationFlag;
    }
  }
  pXVar8 = (this->super_XMLScanner).fDocHandler;
  if (pXVar8 != (XMLDocumentHandler *)0x0) {
    (*pXVar8->_vptr_XMLDocumentHandler[0xb])
              (pXVar8,this_02,(ulong)(this->super_XMLScanner).fEmptyNamespaceId,0,
               (this->super_XMLScanner).fAttrList,pXVar28,(ulong)local_70 & 0xff,
               (ulong)(local_68 == 0));
    return true;
  }
  return true;
}

Assistant:

bool IGXMLScanner::scanStartTag(bool& gotData)
{
    //  Assume we will still have data until proven otherwise. It will only
    //  ever be false if this is the root and its empty.
    gotData = true;

    //  Get the QName. In this case, we are not doing namespaces, so we just
    //  use it as is and don't have to break it into parts.
    if (!fReaderMgr.getName(fQNameBuf))
    {
        emitError(XMLErrs::ExpectedElementName);
        fReaderMgr.skipToChar(chOpenAngle);
        return false;
    }

    // Assume it won't be an empty tag
    bool isEmpty = false;

    //  Lets try to look up the element in the validator's element decl pool
    //  We can pass bogus values for the URI id and the base name. We know that
    //  this can only be called if we are doing a DTD style validator and that
    //  he will only look at the QName.
    //
    //  We tell him to fault in a decl if he does not find one.
    //  Actually, we *don't* tell him to fault in a decl if he does not find one- NG
    bool wasAdded = false;
    const XMLCh *rawQName = fQNameBuf.getRawBuffer();
    XMLElementDecl* elemDecl = fGrammar->getElemDecl
    (
        fEmptyNamespaceId
        , 0
        , rawQName
        , Grammar::TOP_LEVEL_SCOPE
    );
    // look for it in the undeclared pool:
    if(!elemDecl)
    {
        elemDecl = fDTDElemNonDeclPool->getByKey(rawQName);
    }
    if(!elemDecl)
    {
        // we're assuming this must be a DTD element.  DTD's can be
        // used with or without namespaces, but schemas cannot be used without
        // namespaces.
        wasAdded = true;
        elemDecl = new (fMemoryManager) DTDElementDecl
        (
            rawQName
            , fEmptyNamespaceId
            , DTDElementDecl::Any
            , fMemoryManager
        );
        elemDecl->setId(fDTDElemNonDeclPool->put((DTDElementDecl*)elemDecl));
    }

    //  We do something different here according to whether we found the
    //  element or not.
    if (wasAdded)
    {
        // If validating then emit an error
        if (fValidate)
        {
            // This is to tell the reuse Validator that this element was
            // faulted-in, was not an element in the validator pool originally
            elemDecl->setCreateReason(XMLElementDecl::JustFaultIn);

            fValidator->emitError
            (
                XMLValid::ElementNotDefined
                , elemDecl->getFullName()
            );
        }
    }
    else
    {
        // If its not marked declared and validating, then emit an error
        if (fValidate && !elemDecl->isDeclared())
        {
            fValidator->emitError
            (
                XMLValid::ElementNotDefined
                , elemDecl->getFullName()
            );
        }
    }

    // See if its the root element
    const bool isRoot = fElemStack.isEmpty();

    // Expand the element stack and add the new element
    fElemStack.addLevel(elemDecl, fReaderMgr.getCurrentReaderNum());
    fElemStack.setValidationFlag(fValidate);

    //  Validate the element
    if (fValidate)
        fValidator->validateElement(elemDecl);

    //  If this is the first element and we are validating, check the root
    //  element.
    if (isRoot)
    {
        fRootGrammar = fGrammar;

        if (fValidate)
        {
            //  If a DocType exists, then check if it matches the root name there.
            if (fRootElemName && !XMLString::equals(fQNameBuf.getRawBuffer(), fRootElemName))
                fValidator->emitError(XMLValid::RootElemNotLikeDocType);
        }
    }
    else
    {
        //  If the element stack is not empty, then add this element as a
        //  child of the previous top element. If its empty, this is the root
        //  elem and is not the child of anything.
        fElemStack.addChild(elemDecl->getElementName(), true);
    }

    // Skip any whitespace after the name
    fReaderMgr.skipPastSpaces();

    //  We loop until we either see a /> or >, handling attribute/value
    //  pairs until we get there.
    XMLSize_t    attCount = 0;
    XMLSize_t    curAttListSize = fAttrList->size();
    wasAdded = false;

    fElemCount++;

    while (true)
    {
        // And get the next non-space character
        XMLCh nextCh = fReaderMgr.peekNextChar();

        //  If the next character is not a slash or closed angle bracket,
        //  then it must be whitespace, since whitespace is required
        //  between the end of the last attribute and the name of the next
        //  one.
        if (attCount)
        {
            if ((nextCh != chForwardSlash) && (nextCh != chCloseAngle))
            {
                bool bFoundSpace;
                fReaderMgr.skipPastSpaces(bFoundSpace);
                if (!bFoundSpace)
                {
                    // Emit the error but keep on going
                    emitError(XMLErrs::ExpectedWhitespace);
                }
                // Ok, peek another char
                nextCh = fReaderMgr.peekNextChar();
            }
        }

        //  Ok, here we first check for any of the special case characters.
        //  If its not one, then we do the normal case processing, which
        //  assumes that we've hit an attribute value, Otherwise, we do all
        //  the special case checks.
        if (!fReaderMgr.getCurrentReader()->isSpecialStartTagChar(nextCh))
        {
            //  Assume its going to be an attribute, so get a name from
            //  the input.
            if (!fReaderMgr.getName(fAttNameBuf))
            {
                emitError(XMLErrs::ExpectedAttrName);
                fReaderMgr.skipPastChar(chCloseAngle);
                return false;
            }

            // And next must be an equal sign
            if (!scanEq())
            {
                static const XMLCh tmpList[] =
                {
                    chSingleQuote, chDoubleQuote, chCloseAngle
                    , chOpenAngle, chForwardSlash, chNull
                };

                emitError(XMLErrs::ExpectedEqSign);

                //  Try to sync back up by skipping forward until we either
                //  hit something meaningful.
                const XMLCh chFound = fReaderMgr.skipUntilInOrWS(tmpList);

                if ((chFound == chCloseAngle) || (chFound == chForwardSlash))
                {
                    // Jump back to top for normal processing of these
                    continue;
                }
                else if ((chFound == chSingleQuote)
                      ||  (chFound == chDoubleQuote)
                      ||  fReaderMgr.getCurrentReader()->isWhitespace(chFound))
                {
                    // Just fall through assuming that the value is to follow
                }
                else if (chFound == chOpenAngle)
                {
                    // Assume a malformed tag and that new one is starting
                    emitError(XMLErrs::UnterminatedStartTag, elemDecl->getFullName());
                    return false;
                }
                else
                {
                    // Something went really wrong
                    return false;
                }
            }
            //  See if this attribute is declared for this element. If we are
            //  not validating of course it will not be at first, but we will
            //  fault it into the pool (to avoid lots of redundant errors.)
            XMLCh * namePtr = fAttNameBuf.getRawBuffer();
            XMLAttDef* attDef = ((DTDElementDecl *)elemDecl)->getAttDef(namePtr);

            //  Add this attribute to the attribute list that we use to
            //  pass them to the handler. We reuse its existing elements
            //  but expand it as required.
            // Note that we want to this first since this will
            // make a copy of the namePtr; we can then make use of
            // that copy in the hashtable lookup that checks
            // for duplicates.  This will mean we may have to update
            // the type of the XMLAttr later.
            XMLAttr* curAtt;
            if (attCount >= curAttListSize)
            {
                curAtt = new (fMemoryManager) XMLAttr
                (
                    0
                    , namePtr
                    , XMLUni::fgZeroLenString
                    , XMLUni::fgZeroLenString
                    , (attDef)?attDef->getType():XMLAttDef::CData
                    , true
                    , fMemoryManager
                );
                fAttrList->addElement(curAtt);
            }
            else
            {
                curAtt = fAttrList->elementAt(attCount);
                curAtt->set
                (
                    0
                    , namePtr
                    , XMLUni::fgZeroLenString
                    , XMLUni::fgZeroLenString
                    , (attDef)?attDef->getType():XMLAttDef::CData
                );
                curAtt->setSpecified(true);
            }
            // reset namePtr so it refers to newly-allocated memory
            namePtr = (XMLCh *)curAtt->getName();

            if (!attDef)
            {
                //  If there is a validation handler, then we are validating
                //  so emit an error.
                if (fValidate)
                {
                    fValidator->emitError
                    (
                        XMLValid::AttNotDefinedForElement
                        , fAttNameBuf.getRawBuffer()
                        , elemDecl->getFullName()
                    );
                }
                if(!fUndeclaredAttrRegistry->putIfNotPresent(namePtr, 0))
                {
                    emitError
                    (
                        XMLErrs::AttrAlreadyUsedInSTag
                        , namePtr
                        , elemDecl->getFullName()
                     );
                }
            }
            else
            {
                // prepare for duplicate detection
                unsigned int *curCountPtr = fAttDefRegistry->get(attDef);
                if(!curCountPtr)
                {
                    curCountPtr = getNewUIntPtr();
                    *curCountPtr = fElemCount;
                    fAttDefRegistry->put(attDef, curCountPtr);
                }
                else if(*curCountPtr < fElemCount)
                    *curCountPtr = fElemCount;
                else
                {
                    emitError
                    (
                        XMLErrs::AttrAlreadyUsedInSTag
                        , attDef->getFullName()
                        , elemDecl->getFullName()
                    );
                }
            }

            //  Skip any whitespace before the value and then scan the att
            //  value. This will come back normalized with entity refs and
            //  char refs expanded.
            fReaderMgr.skipPastSpaces();
            if (!scanAttValue(attDef, namePtr, fAttValueBuf))
            {
                static const XMLCh tmpList[] =
                {
                    chCloseAngle, chOpenAngle, chForwardSlash, chNull
                };

                emitError(XMLErrs::ExpectedAttrValue);

                //  It failed, so lets try to get synced back up. We skip
                //  forward until we find some whitespace or one of the
                //  chars in our list.
                const XMLCh chFound = fReaderMgr.skipUntilInOrWS(tmpList);

                if ((chFound == chCloseAngle)
                ||  (chFound == chForwardSlash)
                ||  fReaderMgr.getCurrentReader()->isWhitespace(chFound))
                {
                    //  Just fall through and process this attribute, though
                    //  the value will be "".
                }
                else if (chFound == chOpenAngle)
                {
                    // Assume a malformed tag and that new one is starting
                    emitError(XMLErrs::UnterminatedStartTag, elemDecl->getFullName());
                    return false;
                }
                else
                {
                    // Something went really wrong
                    return false;
                }
            }
            // must set the newly-minted value on the XMLAttr:
            curAtt->setValue(fAttValueBuf.getRawBuffer());

            //  Now that its all stretched out, lets look at its type and
            //  determine if it has a valid value. It will output any needed
            //  errors, but we just keep going. We only need to do this if
            //  we are validating.
            if (attDef)
            {
                // Let the validator pass judgement on the attribute value
                if (fValidate)
                {
                    fValidator->validateAttrValue
                    (
                        attDef
                        , fAttValueBuf.getRawBuffer()
                        , false
                        , elemDecl
                    );
                }
            }

            attCount++;
            // And jump back to the top of the loop
            continue;
        }

        //  It was some special case character so do all of the checks and
        //  deal with it.
        if (!nextCh)
            ThrowXMLwithMemMgr(UnexpectedEOFException, XMLExcepts::Gen_UnexpectedEOF, fMemoryManager);

        if (nextCh == chForwardSlash)
        {
            fReaderMgr.getNextChar();
            isEmpty = true;
            if (!fReaderMgr.skippedChar(chCloseAngle))
                emitError(XMLErrs::UnterminatedStartTag, elemDecl->getFullName());
            break;
        }
        else if (nextCh == chCloseAngle)
        {
            fReaderMgr.getNextChar();
            break;
        }
        else if (nextCh == chOpenAngle)
        {
            //  Check for this one specially, since its going to be common
            //  and it is kind of auto-recovering since we've already hit the
            //  next open bracket, which is what we would have seeked to (and
            //  skipped this whole tag.)
            emitError(XMLErrs::UnterminatedStartTag, elemDecl->getFullName());
            break;
        }
        else if ((nextCh == chSingleQuote) || (nextCh == chDoubleQuote))
        {
            //  Check for this one specially, which is probably a missing
            //  attribute name, e.g. ="value". Just issue expected name
            //  error and eat the quoted string, then jump back to the
            //  top again.
            emitError(XMLErrs::ExpectedAttrName);
            fReaderMgr.getNextChar();
            fReaderMgr.skipQuotedString(nextCh);
            fReaderMgr.skipPastSpaces();
            continue;
        }
    }

    if(attCount)
    {
        // clean up after ourselves:
        // clear the map used to detect duplicate attributes
        fUndeclaredAttrRegistry->removeAll();
    }

    //  Ok, so lets get an enumerator for the attributes of this element
    //  and run through them for well formedness and validity checks. But
    //  make sure that we had any attributes before we do it, since the list
    //  would have have gotten faulted in anyway.
    if (elemDecl->hasAttDefs())
    {
        // N.B.:  this assumes DTD validation.
        XMLAttDefList& attDefList = elemDecl->getAttDefList();
        for(XMLSize_t i=0; i<attDefList.getAttDefCount(); i++)
        {
            // Get the current att def, for convenience and its def type
            const XMLAttDef& curDef = attDefList.getAttDef(i);
            const XMLAttDef::DefAttTypes defType = curDef.getDefaultType();

            unsigned int *attCountPtr = fAttDefRegistry->get(&curDef);
            if (!attCountPtr || *attCountPtr < fElemCount)
            { // did not occur
                if (fValidate)
                {
                    // If we are validating and its required, then an error
                    if (defType == XMLAttDef::Required)
                    {
                        fValidator->emitError
                        (
                            XMLValid::RequiredAttrNotProvided
                            , curDef.getFullName()
                        );
                    }
                    else if ((defType == XMLAttDef::Default) ||
		                       (defType == XMLAttDef::Fixed)  )
                    {
                        if (fStandalone && curDef.isExternal())
                        {
                            // XML 1.0 Section 2.9
                            // Document is standalone, so attributes must not be defaulted.
                            fValidator->emitError(XMLValid::NoDefAttForStandalone, curDef.getFullName(), elemDecl->getFullName());

                        }
                    }
                }

                // Fault in the value if needed, and bump the att count
                if ((defType == XMLAttDef::Default)
                ||  (defType == XMLAttDef::Fixed))
                {
                    // Let the validator pass judgement on the attribute value
                    if (fValidate)
                    {
                        fValidator->validateAttrValue
                        (
                            &curDef
                            , curDef.getValue()
                            , false
                            , elemDecl
                        );
                    }

                    XMLAttr* curAtt;
                    if (attCount >= curAttListSize)
                    {
                        curAtt = new (fMemoryManager) XMLAttr
                        (
                            0
                            , curDef.getFullName()
                            , XMLUni::fgZeroLenString
                            , curDef.getValue()
                            , curDef.getType()
                            , false
                            , fMemoryManager
                        );
                        fAttrList->addElement(curAtt);
                        curAttListSize++;
                    }
                    else
                    {
                        curAtt = fAttrList->elementAt(attCount);
                        curAtt->set
                        (
                            0
                            , curDef.getFullName()
                            , XMLUni::fgZeroLenString
                            , curDef.getValue()
                            , curDef.getType()
                        );
                        curAtt->setSpecified(false);
                    }
                    attCount++;
                }
            }
        }
    }

    //  If empty, validate content right now if we are validating and then
    //  pop the element stack top. Else, we have to update the current stack
    //  top's namespace mapping elements.
    if (isEmpty)
    {
        // If validating, then insure that its legal to have no content
        if (fValidate)
        {
            XMLSize_t failure;
            bool res = fValidator->checkContent(elemDecl, 0, 0, &failure);
            if (!res)
            {
                fValidator->emitError
                (
                    XMLValid::ElementNotValidForContent
                    , elemDecl->getFullName()
                    , elemDecl->getFormattedContentModel()
                );
            }
        }

        // Pop the element stack back off since it'll never be used now
        fElemStack.popTop();

        // If the elem stack is empty, then it was an empty root
        if (isRoot)
            gotData = false;
        else {
            // Restore the validation flag
            fValidate = fElemStack.getValidationFlag();
        }
    }

    //  If we have a document handler, then tell it about this start tag. We
    //  don't have any URI id to send along, so send fEmptyNamespaceId. We also do not send
    //  any prefix since its just one big name if we are not doing namespaces.
    if (fDocHandler)
    {
        fDocHandler->startElement
        (
            *elemDecl
            , fEmptyNamespaceId
            , 0
            , *fAttrList
            , attCount
            , isEmpty
            , isRoot
        );
    }

    return true;
}